

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.h
# Opt level: O2

void __thiscall wabt::MemoryImport::~MemoryImport(MemoryImport *this)

{
  (this->super_ImportMixin<(wabt::ExternalKind)2>).super_Import._vptr_Import =
       (_func_int **)&PTR__MemoryImport_001d5e88;
  std::__cxx11::string::_M_dispose();
  Import::~Import((Import *)this);
  return;
}

Assistant:

explicit MemoryImport(std::string_view name = std::string_view())
      : ImportMixin<ExternalKind::Memory>(), memory(name) {}